

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O2

BOOL VIRTUALReleaseMemory(PCMI pMemoryToBeReleased)

{
  _CMI *p_Var1;
  _CMI *p_Var2;
  
  if (pMemoryToBeReleased == (PCMI)0x0) {
    fprintf(_stderr,"] %s %s:%d","VIRTUALReleaseMemory",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x262);
    fprintf(_stderr,"Invalid pointer.\n");
    return 0;
  }
  if (pVirtualMemory == pMemoryToBeReleased) {
    p_Var1 = pMemoryToBeReleased->pNext;
    pVirtualMemory = p_Var1;
    if (p_Var1 == (PCMI)0x0) goto LAB_001fabb7;
    p_Var2 = (_CMI *)0x0;
  }
  else {
    p_Var1 = pMemoryToBeReleased->pNext;
    p_Var2 = pMemoryToBeReleased->pLast;
    if (p_Var2 != (_CMI *)0x0) {
      p_Var2->pNext = p_Var1;
    }
    if (p_Var1 == (_CMI *)0x0) goto LAB_001fabb7;
  }
  p_Var1->pLast = p_Var2;
LAB_001fabb7:
  if (pMemoryToBeReleased->startBoundary <= pVirtualMemoryLastFound->startBoundary) {
    pVirtualMemoryLastFound = (PCMI)0x0;
  }
  CorUnix::InternalFree(pMemoryToBeReleased->pAllocState);
  pMemoryToBeReleased->pAllocState = (BYTE *)0x0;
  CorUnix::InternalFree(pMemoryToBeReleased->pProtectionState);
  pMemoryToBeReleased->pProtectionState = (BYTE *)0x0;
  CorUnix::InternalFree(pMemoryToBeReleased);
  return 1;
}

Assistant:

static BOOL VIRTUALReleaseMemory( PCMI pMemoryToBeReleased )
{
    BOOL bRetVal = TRUE;

    if ( !pMemoryToBeReleased )
    {
        ASSERT( "Invalid pointer.\n" );
        return FALSE;
    }

    if ( pMemoryToBeReleased == pVirtualMemory )
    {
        /* This is either the first entry, or the only entry. */
        pVirtualMemory = pMemoryToBeReleased->pNext;
        if ( pMemoryToBeReleased->pNext )
        {
            pMemoryToBeReleased->pNext->pLast = NULL;
        }
    }
    else /* Could be anywhere in the list. */
    {
        /* Delete the entry from the linked list. */
        if ( pMemoryToBeReleased->pLast )
        {
            pMemoryToBeReleased->pLast->pNext = pMemoryToBeReleased->pNext;
        }

        if ( pMemoryToBeReleased->pNext )
        {
            pMemoryToBeReleased->pNext->pLast = pMemoryToBeReleased->pLast;
        }
    }

    if (pVirtualMemoryLastFound->startBoundary >= pMemoryToBeReleased->startBoundary)
    {
        pVirtualMemoryLastFound = NULL;
    }

#if MMAP_IGNORES_HINT
    // We've removed the block from our allocated list. Add it to the
    // free list.
    bRetVal = VIRTUALAddToFreeList(pMemoryToBeReleased);
#endif  // MMAP_IGNORES_HINT

    InternalFree( pMemoryToBeReleased->pAllocState );
    pMemoryToBeReleased->pAllocState = NULL;

    InternalFree( pMemoryToBeReleased->pProtectionState );
    pMemoryToBeReleased->pProtectionState = NULL;

#if MMAP_DOESNOT_ALLOW_REMAP
    InternalFree( pMemoryToBeReleased->pDirtyPages );
    pMemoryToBeReleased->pDirtyPages = NULL;
#endif // MMAP_DOESNOT_ALLOW_REMAP

    InternalFree( pMemoryToBeReleased );
    pMemoryToBeReleased = NULL;

    return bRetVal;
}